

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O0

void __thiscall CMud::LoadOptions(CMud *this)

{
  int iVar1;
  long in_RDI;
  size_t *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  RString *this_00;
  RString local_78 [3];
  char *in_stack_ffffffffffffffa0;
  Config *in_stack_ffffffffffffffa8;
  string local_28 [40];
  
  Config::GetValue_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  iVar1 = std::__cxx11::stoi(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  *(int *)(in_RDI + 0x1f0) = iVar1;
  std::__cxx11::string::~string(local_28);
  Config::GetValue_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::c_str();
  RString::operator=((RString *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  this_00 = local_78;
  Config::GetValue_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::c_str();
  RString::operator=(this_00,(char *)in_stack_ffffffffffffff58);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void CMud::LoadOptions()
{
	game_port = stoi(Settings.GetValue("Port"));
	base_directory = (Settings.GetValue("BaseDir").c_str());
	player_dir = (Settings.GetValue("PlayerDir").c_str());
}